

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

size_t bitset_count(bitset_t *bitset)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long *in_RDI;
  size_t k;
  size_t card;
  ulong local_18;
  size_t local_10;
  
  local_10 = 0;
  for (local_18 = 0; local_18 + 7 < (ulong)in_RDI[1]; local_18 = local_18 + 8) {
    iVar1 = roaring_hamming(*(uint64_t *)(*in_RDI + local_18 * 8));
    iVar2 = roaring_hamming(*(uint64_t *)(*in_RDI + 8 + local_18 * 8));
    iVar3 = roaring_hamming(*(uint64_t *)(*in_RDI + 0x10 + local_18 * 8));
    iVar4 = roaring_hamming(*(uint64_t *)(*in_RDI + 0x18 + local_18 * 8));
    iVar5 = roaring_hamming(*(uint64_t *)(*in_RDI + 0x20 + local_18 * 8));
    iVar6 = roaring_hamming(*(uint64_t *)(*in_RDI + 0x28 + local_18 * 8));
    iVar7 = roaring_hamming(*(uint64_t *)(*in_RDI + 0x30 + local_18 * 8));
    iVar8 = roaring_hamming(*(uint64_t *)(*in_RDI + 0x38 + local_18 * 8));
    local_10 = (long)iVar8 +
               (long)iVar7 +
               (long)iVar6 +
               (long)iVar5 + (long)iVar4 + (long)iVar3 + (long)iVar2 + (long)iVar1 + local_10;
  }
  for (; local_18 + 3 < (ulong)in_RDI[1]; local_18 = local_18 + 4) {
    iVar1 = roaring_hamming(*(uint64_t *)(*in_RDI + local_18 * 8));
    iVar2 = roaring_hamming(*(uint64_t *)(*in_RDI + 8 + local_18 * 8));
    iVar3 = roaring_hamming(*(uint64_t *)(*in_RDI + 0x10 + local_18 * 8));
    iVar4 = roaring_hamming(*(uint64_t *)(*in_RDI + 0x18 + local_18 * 8));
    local_10 = (long)iVar4 + (long)iVar3 + (long)iVar2 + (long)iVar1 + local_10;
  }
  for (; local_18 < (ulong)in_RDI[1]; local_18 = local_18 + 1) {
    iVar1 = roaring_hamming(*(uint64_t *)(*in_RDI + local_18 * 8));
    local_10 = (long)iVar1 + local_10;
  }
  return local_10;
}

Assistant:

size_t bitset_count(const bitset_t *bitset) {
    size_t card = 0;
    size_t k = 0;
    for (; k + 7 < bitset->arraysize; k += 8) {
        card += roaring_hamming(bitset->array[k]);
        card += roaring_hamming(bitset->array[k + 1]);
        card += roaring_hamming(bitset->array[k + 2]);
        card += roaring_hamming(bitset->array[k + 3]);
        card += roaring_hamming(bitset->array[k + 4]);
        card += roaring_hamming(bitset->array[k + 5]);
        card += roaring_hamming(bitset->array[k + 6]);
        card += roaring_hamming(bitset->array[k + 7]);
    }
    for (; k + 3 < bitset->arraysize; k += 4) {
        card += roaring_hamming(bitset->array[k]);
        card += roaring_hamming(bitset->array[k + 1]);
        card += roaring_hamming(bitset->array[k + 2]);
        card += roaring_hamming(bitset->array[k + 3]);
    }
    for (; k < bitset->arraysize; k++) {
        card += roaring_hamming(bitset->array[k]);
    }
    return card;
}